

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O2

void duckdb::Node48::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  byte bVar1;
  Node48 *pNVar2;
  ulong uVar3;
  byte bVar4;
  Node node48;
  
  pNVar2 = Node::Ref<duckdb::Node48>(art,(Node)(node->super_IndexPointer).data,NODE_48);
  bVar1 = pNVar2->count;
  uVar3 = (ulong)bVar1;
  if (uVar3 == 0x30) {
    node48 = (Node)(node->super_IndexPointer).data;
    Node256::GrowNode48(art,node,&node48);
    Node256::InsertChild(art,node,byte,child);
  }
  else {
    bVar4 = bVar1;
    if (*(char *)((long)&pNVar2->children[uVar3].super_IndexPointer.data + 7) != '\0') {
      bVar4 = 0xff;
      do {
        bVar4 = bVar4 + 1;
        uVar3 = (ulong)bVar4;
      } while (0xffffffffffffff < pNVar2->children[uVar3].super_IndexPointer.data);
    }
    pNVar2->children[uVar3].super_IndexPointer.data = (idx_t)child.super_IndexPointer.data;
    pNVar2->child_index[byte] = bVar4;
    pNVar2->count = bVar1 + 1;
  }
  return;
}

Assistant:

void Node48::InsertChild(ART &art, Node &node, const uint8_t byte, const Node child) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	// The node is full. Grow to Node256.
	if (n48.count == CAPACITY) {
		auto node48 = node;
		Node256::GrowNode48(art, node, node48);
		Node256::InsertChild(art, node, byte, child);
		return;
	}

	// Still space. Insert the child.
	uint8_t child_pos = n48.count;
	if (n48.children[child_pos].HasMetadata()) {
		// Find an empty position in the node list.
		child_pos = 0;
		while (n48.children[child_pos].HasMetadata()) {
			child_pos++;
		}
	}

	n48.children[child_pos] = child;
	n48.child_index[byte] = child_pos;
	n48.count++;
}